

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# run.h
# Opt level: O0

_Bool run_container_contains(run_container_t *run,uint16_t pos)

{
  int32_t iVar1;
  int iVar2;
  uint16_t in_SI;
  int32_t *in_RDI;
  int32_t le;
  int32_t offset;
  int32_t index;
  _Bool local_1;
  
  iVar1 = interleavedBinarySearch(*(rle16_t **)(in_RDI + 2),*in_RDI,in_SI);
  if (iVar1 < 0) {
    iVar2 = -2 - iVar1;
    if ((iVar2 == -1) ||
       ((int)(uint)*(ushort *)(*(long *)(in_RDI + 2) + 2 + (long)iVar2 * 4) <
        (int)((uint)in_SI - (uint)*(ushort *)(*(long *)(in_RDI + 2) + (long)iVar2 * 4)))) {
      local_1 = false;
    }
    else {
      local_1 = true;
    }
  }
  else {
    local_1 = true;
  }
  return local_1;
}

Assistant:

inline bool run_container_contains(const run_container_t *run, uint16_t pos) {
    int32_t index = interleavedBinarySearch(run->runs, run->n_runs, pos);
    if (index >= 0) return true;
    index = -index - 2;  // points to preceding value, possibly -1
    if (index != -1) {   // possible match
        int32_t offset = pos - run->runs[index].value;
        int32_t le = run->runs[index].length;
        if (offset <= le) return true;
    }
    return false;
}